

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O2

REF_STATUS
extract_displaced_xyz(REF_NODE ref_node,REF_INT *ldim,REF_DBL **initial_field,REF_DBL **displaced)

{
  int iVar1;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar4 = ref_node->max;
  if ((int)uVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb0d,"extract_displaced_xyz","malloc *displaced of REF_DBL negative");
    RVar5 = 1;
  }
  else {
    pRVar3 = (REF_DBL *)malloc((ulong)uVar4 * 0x18);
    *displaced = pRVar3;
    if (pRVar3 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb0d,"extract_displaced_xyz","malloc *displaced of REF_DBL NULL");
    }
    else {
      lVar6 = 0;
      for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
        if (-1 < ref_node->global[uVar7]) {
          iVar1 = *ldim;
          pRVar2 = *initial_field;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            pRVar3[lVar10] = *(REF_DBL *)((long)pRVar2 + lVar10 * 8 + iVar1 * lVar6);
          }
        }
        pRVar3 = pRVar3 + 3;
        lVar6 = lVar6 + 8;
      }
      iVar1 = *ldim;
      uVar4 = iVar1 - 3;
      *ldim = uVar4;
      uVar7 = 0;
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      uVar9 = (ulong)(uint)ref_node->max;
      if (ref_node->max < 1) {
        uVar9 = uVar7;
      }
      iVar11 = 3;
      for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
        uVar14 = uVar8;
        uVar15 = uVar7;
        iVar13 = iVar11;
        if (-1 < ref_node->global[uVar12]) {
          while (uVar14 != 0) {
            *(REF_DBL *)((long)*initial_field + uVar15) = (*initial_field)[iVar13];
            uVar14 = uVar14 - 1;
            uVar15 = uVar15 + 8;
            iVar13 = iVar13 + 1;
          }
        }
        uVar7 = uVar7 + (long)(int)uVar4 * 8;
        iVar11 = iVar11 + iVar1;
      }
      fflush(_stdout);
      uVar4 = ref_node->max * *ldim;
      pRVar3 = *initial_field;
      if (0 < (int)uVar4) {
        pRVar3 = (REF_DBL *)realloc(pRVar3,(ulong)uVar4 << 3);
        *initial_field = pRVar3;
      }
      if (pRVar3 != (REF_DBL *)0x0) {
        return 0;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb1a,"extract_displaced_xyz","realloc *initial_field NULL");
      uVar7 = (long)ref_node->max * (long)*ldim;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar7 & 0xffffffff,uVar7,8,
             uVar7 * 8);
    }
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

static REF_STATUS extract_displaced_xyz(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **initial_field,
                                        REF_DBL **displaced) {
  REF_INT i, node;

  ref_malloc(*displaced, 3 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      (*displaced)[i + 3 * node] = (*initial_field)[i + (*ldim) * node];
    }
  }
  (*ldim) -= 3;
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < (*ldim); i++) {
      (*initial_field)[i + (*ldim) * node] =
          (*initial_field)[i + 3 + ((*ldim) + 3) * node];
    }
  }
  ref_realloc(*initial_field, (*ldim) * ref_node_max(ref_node), REF_DBL);
  return REF_SUCCESS;
}